

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void parse_label(LexState *ls)

{
  uint8_t *puVar1;
  int iVar2;
  FuncState *pFVar3;
  MSize idx;
  GCstr *name;
  VarInfo *pVVar4;
  FuncScope *bl;
  
  pFVar3 = ls->fs;
  pFVar3->lasttarget = pFVar3->pc;
  puVar1 = &pFVar3->bl->flags;
  *puVar1 = *puVar1 | 4;
  lj_lex_next(ls);
  name = lex_str(ls);
  pVVar4 = gola_findlabel(ls,name);
  if (pVVar4 == (VarInfo *)0x0) {
    idx = gola_new(ls,name,'\x04',pFVar3->pc);
    lex_check(ls,0x11d);
    while (iVar2 = ls->tok, iVar2 == 0x11d) {
      synlevel_begin(ls);
      parse_label(ls);
      ls->level = ls->level - 1;
    }
    if ((iVar2 - 0x104U < 3) || (iVar2 == 0x121)) {
      bl = pFVar3->bl;
      ls->vstack[idx].slot = bl->nactvar;
    }
    else {
      bl = pFVar3->bl;
    }
    gola_resolve(ls,bl,idx);
    return;
  }
  lj_lex_error(ls,0,LJ_ERR_XLDUP,name + 1);
}

Assistant:

static void parse_label(LexState *ls)
{
  FuncState *fs = ls->fs;
  GCstr *name;
  MSize idx;
  fs->lasttarget = fs->pc;
  fs->bl->flags |= FSCOPE_GOLA;
  lj_lex_next(ls);  /* Skip '::'. */
  name = lex_str(ls);
  if (gola_findlabel(ls, name))
    lj_lex_error(ls, 0, LJ_ERR_XLDUP, strdata(name));
  idx = gola_new(ls, name, VSTACK_LABEL, fs->pc);
  lex_check(ls, TK_label);
  /* Recursively parse trailing statements: labels and ';' (Lua 5.2 only). */
  for (;;) {
    if (ls->tok == TK_label) {
      synlevel_begin(ls);
      parse_label(ls);
      synlevel_end(ls);
    } else if (LJ_52 && ls->tok == ';') {
      lj_lex_next(ls);
    } else {
      break;
    }
  }
  /* Trailing label is considered to be outside of scope. */
  if (parse_isend(ls->tok) && ls->tok != TK_until)
    ls->vstack[idx].slot = fs->bl->nactvar;
  gola_resolve(ls, fs->bl, idx);
}